

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCase::createDrawCommand
          (ComputeShaderGeneratedCase *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  undefined1 local_94 [8];
  DrawElementsCommand data_1;
  deUint32 firstTri_1;
  int ndx_1;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
  cmds_1;
  undefined1 local_50 [8];
  DrawArraysCommand data;
  deUint32 firstTri;
  int ndx;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
  cmds;
  deUint32 numDrawCallTris;
  int triangleCount;
  Functions *gl;
  ComputeShaderGeneratedCase *this_local;
  long lVar4;
  
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  cmds.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = this->m_gridSize * this->m_gridSize * 2
  ;
  cmds.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       cmds.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ / this->m_numDrawCmds;
  if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
              *)&firstTri);
    for (data.reservedMustBeZero = 0; (int)data.reservedMustBeZero < this->m_numDrawCmds;
        data.reservedMustBeZero = data.reservedMustBeZero + 1) {
      data.first = data.reservedMustBeZero *
                   (int)cmds.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_50._0_4_ =
           (int)cmds.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage * 3;
      local_50._4_4_ = 1;
      data.count = data.first * 3;
      data.primCount = 0;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                   *)&firstTri,(value_type *)local_50);
    }
    (**(code **)(lVar4 + 0x40))(0x8f3f,this->m_cmdBufferID);
    pcVar1 = *(code **)(lVar4 + 0x150);
    sVar5 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
            ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                    *)&firstTri);
    pvVar6 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
             ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                           *)&firstTri,0);
    (*pcVar1)(0x8f3f,sVar5 << 4,pvVar6,0x88e4);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
               *)&firstTri);
  }
  else if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
              *)&firstTri_1);
    for (data_1.reservedMustBeZero = 0; (int)data_1.reservedMustBeZero < this->m_numDrawCmds;
        data_1.reservedMustBeZero = data_1.reservedMustBeZero + 1) {
      data_1.baseVertex =
           data_1.reservedMustBeZero *
           (int)cmds.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_94._0_4_ =
           (int)cmds.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawArraysCommand>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage * 3;
      local_94._4_4_ = 1;
      data_1.count = data_1.baseVertex * 3;
      data_1.primCount = 0;
      data_1.firstIndex = 0;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
      ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                   *)&firstTri_1,(value_type *)local_94);
    }
    (**(code **)(lVar4 + 0x40))(0x8f3f,this->m_cmdBufferID);
    pcVar1 = *(code **)(lVar4 + 0x150);
    sVar5 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
            ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                    *)&firstTri_1);
    pvVar7 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
             ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
                           *)&firstTri_1,0);
    (*pcVar1)(0x8f3f,sVar5 * 0x14,pvVar7,0x88e4);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawElementsCommand>_>
               *)&firstTri_1);
  }
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"create draw command",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x572);
  return;
}

Assistant:

void ComputeShaderGeneratedCase::createDrawCommand (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				triangleCount	= m_gridSize * m_gridSize * 2;
	const deUint32			numDrawCallTris	= triangleCount / m_numDrawCmds;

	if (m_drawMethod == DRAWMETHOD_DRAWARRAYS)
	{
		std::vector<DrawArraysCommand> cmds;

		for (int ndx = 0; ndx < m_numDrawCmds; ++ndx)
		{
			const deUint32				firstTri = ndx * numDrawCallTris;
			DrawArraysCommand			data;

			data.count					= numDrawCallTris*3;
			data.primCount				= 1;
			data.first					= firstTri*3;
			data.reservedMustBeZero		= 0;

			cmds.push_back(data);
		}

		DE_ASSERT((int)(sizeof(DrawArraysCommand)*cmds.size()) == m_numDrawCmds * m_commandSize);

		gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, m_cmdBufferID);
		gl.bufferData(GL_DRAW_INDIRECT_BUFFER, (glw::GLsizeiptr)(sizeof(DrawArraysCommand)*cmds.size()), &cmds[0], GL_STATIC_DRAW);
	}
	else if (m_drawMethod == DRAWMETHOD_DRAWELEMENTS)
	{
		std::vector<DrawElementsCommand> cmds;

		for (int ndx = 0; ndx < m_numDrawCmds; ++ndx)
		{
			const deUint32			firstTri = ndx * numDrawCallTris;
			DrawElementsCommand		data;

			data.count				= numDrawCallTris*3;
			data.primCount			= 1;
			data.firstIndex			= firstTri*3;
			data.baseVertex			= 0;
			data.reservedMustBeZero	= 0;

			cmds.push_back(data);
		}

		DE_ASSERT((int)(sizeof(DrawElementsCommand)*cmds.size()) == m_numDrawCmds * m_commandSize);

		gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, m_cmdBufferID);
		gl.bufferData(GL_DRAW_INDIRECT_BUFFER, (glw::GLsizeiptr)(sizeof(DrawElementsCommand)*cmds.size()), &cmds[0], GL_STATIC_DRAW);
	}
	else
		DE_ASSERT(false);

	glu::checkError(gl.getError(), "create draw command", __FILE__, __LINE__);
}